

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O2

_Bool has_normative_scaler_ssse3(int src_width,int src_height,int dst_width,int dst_height)

{
  if (dst_height * 2 != src_height || dst_width * 2 != src_width) {
    if ((dst_height * 4 != src_height || dst_width * 4 != src_width) &&
       ((dst_width * 4 != src_width * 3 || (dst_height * 4 != src_height * 3)))) {
      return src_height * 2 == dst_height && src_width * 2 == dst_width;
    }
  }
  return true;
}

Assistant:

static inline bool has_normative_scaler_ssse3(const int src_width,
                                              const int src_height,
                                              const int dst_width,
                                              const int dst_height) {
  const bool has_normative_scaler =
      (2 * dst_width == src_width && 2 * dst_height == src_height) ||
      (4 * dst_width == src_width && 4 * dst_height == src_height) ||
      (4 * dst_width == 3 * src_width && 4 * dst_height == 3 * src_height) ||
      (dst_width == src_width * 2 && dst_height == src_height * 2);

  return has_normative_scaler;
}